

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O3

int writeMPS_dense_cpp(char *filename,int *numRow_p,int *numCol_p,int *objSense_p,
                      double *objOffset_p,double **A_rw_p,double **rhs_p,double **cost_p,
                      double **lb_p,double **ub_p,int **integerColumn_p)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  int *piVar7;
  int iVar8;
  size_type sVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  size_type __new_size;
  int objSense;
  int numCol;
  int numRow;
  vector<double,_std::allocator<double>_> ub;
  vector<double,_std::allocator<double>_> lb;
  vector<double,_std::allocator<double>_> cost;
  vector<double,_std::allocator<double>_> rhs;
  vector<int,_std::allocator<int>_> integerColumn;
  double objOffset;
  vector<double,_std::allocator<double>_> A_rw;
  
  A_rw.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  A_rw.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  A_rw.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  integerColumn.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  integerColumn.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  integerColumn.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  uVar2 = *numRow_p;
  uVar3 = *numCol_p;
  uVar10 = *objSense_p;
  dVar1 = *objOffset_p;
  objSense = uVar10;
  numCol = uVar3;
  numRow = uVar2;
  objOffset = dVar1;
  printf("writeMPS_dense_cpp: Model has %d rows and %d columns\n",(ulong)uVar2,(ulong)uVar3);
  printf("writeMPS_dense_cpp: Objective sense is %d; Objective offset is %g\n",SUB84(dVar1,0),
         (ulong)uVar10);
  uVar10 = uVar3 * uVar2;
  std::vector<double,_std::allocator<double>_>::resize(&A_rw,(long)(int)uVar10);
  std::vector<double,_std::allocator<double>_>::resize(&rhs,(long)(int)uVar2);
  __new_size = (size_type)(int)uVar3;
  std::vector<double,_std::allocator<double>_>::resize(&cost,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&lb,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&ub,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&integerColumn,__new_size);
  puts("writeMPS_dense_cpp: Allocated space");
  std::ostream::flush();
  if (0 < (int)uVar10) {
    pdVar4 = *A_rw_p;
    uVar11 = 0;
    do {
      A_rw.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar11] = pdVar4[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
  if (0 < (int)uVar2) {
    pdVar4 = *rhs_p;
    sVar9 = 0;
    do {
      rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar9] = pdVar4[sVar9];
      sVar9 = sVar9 + 1;
    } while ((long)(int)uVar2 != sVar9);
  }
  if (0 < (int)uVar3) {
    pdVar4 = *cost_p;
    pdVar5 = *lb_p;
    pdVar6 = *ub_p;
    piVar7 = *integerColumn_p;
    lVar12 = 0;
    do {
      *(undefined8 *)
       ((long)cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar12 * 2) =
           *(undefined8 *)((long)pdVar4 + lVar12 * 2);
      *(undefined8 *)
       ((long)lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_start + lVar12 * 2) = *(undefined8 *)((long)pdVar5 + lVar12 * 2);
      *(undefined8 *)
       ((long)ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_start + lVar12 * 2) = *(undefined8 *)((long)pdVar6 + lVar12 * 2);
      *(undefined4 *)
       ((long)integerColumn.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + lVar12) = *(undefined4 *)((long)piVar7 + lVar12);
      lVar12 = lVar12 + 4;
    } while (__new_size * 4 != lVar12);
  }
  puts("writeMPS_dense_cpp: Copied A, RHS, costs and bounds");
  std::ostream::flush();
  iVar8 = writeMPS_dense(filename,&numRow,&numCol,&objSense,&objOffset,&A_rw,&rhs,&cost,&lb,&ub,
                         &integerColumn);
  if (integerColumn.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(integerColumn.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (A_rw.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(A_rw.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return iVar8;
}

Assistant:

int writeMPS_dense_cpp(const char *filename, int* numRow_p, int* numCol_p, int* objSense_p, double* objOffset_p,
		     double ** A_rw_p,
		     double ** rhs_p, double ** cost_p, double ** lb_p, double ** ub_p,
		     int** integerColumn_p) {
  int numRow, numCol, objSense;
  double objOffset;
  vector<double> A_rw, rhs, cost, lb, ub;
  vector<int> integerColumn;
  numRow = (*numRow_p);
  numCol = (*numCol_p);
  objSense = (*objSense_p);
  objOffset = (*objOffset_p);
#ifdef JAJH_dev
  printf("writeMPS_dense_cpp: Model has %d rows and %d columns\n", numRow, numCol);
  printf("writeMPS_dense_cpp: Objective sense is %d; Objective offset is %g\n", objSense, objOffset);
#endif
  A_rw.resize(numRow*numCol);
  rhs.resize(numRow);
  cost.resize(numCol);
  lb.resize(numCol);
  ub.resize(numCol);
  integerColumn.resize(numCol);
  printf("writeMPS_dense_cpp: Allocated space\n");cout<<flush;
  for (int ix_n=0; ix_n<numRow*numCol; ix_n++) {
    A_rw[ix_n] = (*A_rw_p)[ix_n];
  }
  for (int r_n=0; r_n<numRow; r_n++) {
    rhs[r_n] = (*rhs_p)[r_n];
  }
  for (int c_n=0; c_n<numCol; c_n++) {
    cost[c_n] = (*cost_p)[c_n];
    lb[c_n] = (*lb_p)[c_n];
    ub[c_n] = (*ub_p)[c_n];
    integerColumn[c_n] = (*integerColumn_p)[c_n];
  }
  printf("writeMPS_dense_cpp: Copied A, RHS, costs and bounds\n");cout<<flush;
  int rtCd = writeMPS_dense(filename, numRow, numCol, objSense, objOffset,
			    A_rw,
			    rhs, cost, lb, ub,
			    integerColumn);
  return rtCd;
}